

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Little_Hexy.cpp
# Opt level: O2

vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *
chrono::copter::Little_Hexy::getPosVect(void)

{
  undefined1 auVar1 [16];
  int i;
  int iVar2;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *in_RDI;
  double dVar3;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined8 in_XMM2_Qb;
  value_type local_38;
  undefined1 extraout_var [56];
  
  (in_RDI->super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar2 = 0; iVar2 != 6; iVar2 = iVar2 + 1) {
    auVar5._0_8_ = (double)iVar2 / 3.0;
    auVar5._8_8_ = in_XMM2_Qb;
    auVar1 = vfmadd132sd_fma(auVar5,ZEXT816(0x3fe0c152382d7365),ZEXT816(0x400921fb54442d18));
    dVar3 = cos(auVar1._0_8_);
    auVar4._0_8_ = sin(auVar1._0_8_);
    auVar4._8_56_ = extraout_var;
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_8_ = dVar3;
    auVar1 = vunpcklpd_avx(auVar1,auVar4._0_16_);
    local_38.m_data[0] = auVar1._0_8_ * 0.762;
    local_38.m_data[1] = auVar1._8_8_ * 0.762;
    local_38.m_data[2] = 0.279;
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (in_RDI,&local_38);
  }
  return in_RDI;
}

Assistant:

std::vector<ChVector<>> Little_Hexy::getPosVect() {
    std::vector<ChVector<>> ppos;
    for (int i = 0; i < 6; i++) {
        double ang = CH_C_PI * (i / 3.0) + CH_C_PI / 6;
        double R = 0.762;
        ChVector<> pos(std::cos(ang) * R, std::sin(ang) * R, 0.279);
        ppos.push_back(pos);
    }
    return ppos;
}